

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O0

RefNull * wasm::ExpressionManipulator::refNull<wasm::Block>(Block *target,Type type)

{
  bool bVar1;
  RefNull *this;
  bool local_31;
  RefNull *ret;
  Block *local_18;
  Block *target_local;
  Type type_local;
  
  local_18 = target;
  target_local = (Block *)type.id;
  bVar1 = wasm::Type::isNullable((Type *)&target_local);
  local_31 = false;
  if (bVar1) {
    ret = (RefNull *)wasm::Type::getHeapType((Type *)&target_local);
    local_31 = HeapType::isBottom((HeapType *)&ret);
  }
  if (local_31 != false) {
    this = convert<wasm::Block,wasm::RefNull>(local_18);
    RefNull::finalize(this,(Type)target_local);
    return this;
  }
  __assert_fail("type.isNullable() && type.getHeapType().isBottom()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h"
                ,0x2c,
                "RefNull *wasm::ExpressionManipulator::refNull(InputType *, Type) [InputType = wasm::Block]"
               );
}

Assistant:

inline RefNull* refNull(InputType* target, Type type) {
  assert(type.isNullable() && type.getHeapType().isBottom());
  auto* ret = convert<InputType, RefNull>(target);
  ret->finalize(type);
  return ret;
}